

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
UtestShell::assertLongsEqual
          (UtestShell *this,long expected,long actual,char *text,char *fileName,size_t lineNumber,
          TestTerminator *testTerminator)

{
  TestResult *pTVar1;
  long in_RCX;
  char *in_RDX;
  char *in_RSI;
  UtestShell *in_RDI;
  long in_R8;
  LongsEqualFailure *unaff_retaddr;
  undefined8 in_stack_00000008;
  SimpleString *in_stack_00000010;
  UtestShell *in_stack_ffffffffffffff08;
  SimpleString *in_stack_ffffffffffffff10;
  undefined1 local_98 [112];
  UtestShell *test;
  
  test = in_RDI;
  pTVar1 = getTestResult(in_stack_ffffffffffffff08);
  (*pTVar1->_vptr_TestResult[10])();
  if (in_RSI != in_RDX) {
    SimpleString::SimpleString(in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08);
    LongsEqualFailure::LongsEqualFailure
              (unaff_retaddr,test,in_RSI,(size_t)in_RDX,in_RCX,in_R8,in_stack_00000010);
    (*in_RDI->_vptr_UtestShell[0x27])(in_RDI,local_98,in_stack_00000008);
    LongsEqualFailure::~LongsEqualFailure((LongsEqualFailure *)0x11fa95);
    SimpleString::~SimpleString((SimpleString *)0x11fa9f);
  }
  return;
}

Assistant:

void UtestShell::assertLongsEqual(long expected, long actual, const char* text, const char* fileName, size_t lineNumber, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
    if (expected != actual)
        failWith(LongsEqualFailure (this, fileName, lineNumber, expected, actual, text), testTerminator);
}